

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausProcessClausesCut(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint *puVar2;
  int local_13c;
  int nWordsForSim;
  int j;
  int k;
  int i;
  int nSeries;
  uint uWord;
  uint *pSims [16];
  uint Matrix [32];
  int *pScores_local;
  Dar_Cut_t *pCut_local;
  Fra_Sml_t *pSimMan_local;
  Clu_Man_t *p_local;
  
  iVar1 = pSimMan->nWordsTotal - p->nSimWordsPref;
  if ((1 < *(uint *)&pCut->field_0x4 >> 0x1d) && (*(uint *)&pCut->field_0x4 >> 0x1d < 5)) {
    if (iVar1 % 8 == 0) {
      for (j = 0; j < (int)(*(uint *)&pCut->field_0x4 >> 0x1d); j = j + 1) {
        puVar2 = Fra_ObjSim(pSimMan,pCut->pLeaves[j]);
        *(uint **)(&nSeries + (long)j * 2) = puVar2 + p->nSimWordsPref;
      }
      memset(pScores,0,0x40);
      for (j = 0; j < iVar1 / 8; j = j + 1) {
        memset(pSims + 0xf,0,0x80);
        for (nWordsForSim = 0; nWordsForSim < 8; nWordsForSim = nWordsForSim + 1) {
          for (local_13c = 0; local_13c < (int)(*(uint *)&pCut->field_0x4 >> 0x1d);
              local_13c = local_13c + 1) {
            Matrix[(long)(0x1f - (nWordsForSim * 4 + local_13c)) + -2] =
                 *(uint *)(*(long *)(&nSeries + (long)local_13c * 2) +
                          (long)(j * 8 + nWordsForSim) * 4);
          }
        }
        transpose32a((uint *)(pSims + 0xf));
        for (nWordsForSim = 0; nWordsForSim < 0x20; nWordsForSim = nWordsForSim + 1) {
          local_13c = 0;
          i = Matrix[(long)nWordsForSim + -2];
          for (; local_13c < 8; local_13c = local_13c + 1) {
            pScores[i & 0xfU] = pScores[i & 0xfU] + 1;
            i = (uint)i >> 4;
          }
        }
      }
      i = 0;
      for (j = 0; j < 0x10; j = j + 1) {
        if (pScores[j] != 0) {
          i = 1 << ((byte)j & 0x1f) | i;
        }
      }
      return i;
    }
    __assert_fail("nWordsForSim % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0xd2,
                  "int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                ,0xd1,"int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)"
               );
}

Assistant:

int Fra_ClausProcessClausesCut( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int nSeries, i, k, j;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    nSeries = nWordsForSim / 8;
    for ( i = 0; i < nSeries; i++ )
    {
        memset( Matrix, 0, sizeof(unsigned) * 32 );
        for ( k = 0; k < 8; k++ )
            for ( j = 0; j < (int)pCut->nLeaves; j++ )
                Matrix[31-(k*4+j)] = pSims[j][i*8+k];
        transpose32a( Matrix );
        for ( k = 0; k < 32; k++ )
            for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                pScores[uWord & 0xF]++;
    }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}